

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DeleteTriggerStep(sqlite3 *db,TriggerStep *pTriggerStep)

{
  TriggerStep *pTVar1;
  TriggerStep *pTmp;
  
  if (pTriggerStep != (TriggerStep *)0x0) {
    do {
      pTVar1 = pTriggerStep->pNext;
      if (pTriggerStep->pWhere != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,pTriggerStep->pWhere);
      }
      if (pTriggerStep->pExprList != (ExprList *)0x0) {
        exprListDeleteNN(db,pTriggerStep->pExprList);
      }
      if (pTriggerStep->pSelect != (Select *)0x0) {
        clearSelect(db,pTriggerStep->pSelect,1);
      }
      sqlite3IdListDelete(db,pTriggerStep->pIdList);
      sqlite3UpsertDelete(db,pTriggerStep->pUpsert);
      if (pTriggerStep->zSpan != (char *)0x0) {
        sqlite3DbFreeNN(db,pTriggerStep->zSpan);
      }
      sqlite3DbFreeNN(db,pTriggerStep);
      pTriggerStep = pTVar1;
    } while (pTVar1 != (TriggerStep *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTriggerStep(sqlite3 *db, TriggerStep *pTriggerStep){
  while( pTriggerStep ){
    TriggerStep * pTmp = pTriggerStep;
    pTriggerStep = pTriggerStep->pNext;

    sqlite3ExprDelete(db, pTmp->pWhere);
    sqlite3ExprListDelete(db, pTmp->pExprList);
    sqlite3SelectDelete(db, pTmp->pSelect);
    sqlite3IdListDelete(db, pTmp->pIdList);
    sqlite3UpsertDelete(db, pTmp->pUpsert);
    sqlite3DbFree(db, pTmp->zSpan);

    sqlite3DbFree(db, pTmp);
  }
}